

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMemory.c
# Opt level: O0

void Extra_MmStepEntryRecycle(Extra_MmStep_t *p,char *pEntry,int nBytes)

{
  int nBytes_local;
  char *pEntry_local;
  Extra_MmStep_t *p_local;
  
  if ((nBytes != 0) && (nBytes <= p->nMapSize)) {
    Extra_MmFixedEntryRecycle(p->pMap[nBytes],pEntry);
  }
  return;
}

Assistant:

void Extra_MmStepEntryRecycle( Extra_MmStep_t * p, char * pEntry, int nBytes )
{
    if ( nBytes == 0 )
        return;
    if ( nBytes > p->nMapSize )
    {
//        ABC_FREE( pEntry );
        return;
    }
    Extra_MmFixedEntryRecycle( p->pMap[nBytes], pEntry );
}